

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintTuple.h
# Opt level: O3

void __thiscall
chrono::ChConstraintTuple_1vars<chrono::ChVariableTupleCarrier_1vars<3>_>::SetVariables
          (ChConstraintTuple_1vars<chrono::ChVariableTupleCarrier_1vars<3>_> *this,
          ChVariableTupleCarrier_1vars<3> *m_tuple_carrier)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ChException *this_00;
  string local_40;
  
  iVar1 = (*m_tuple_carrier->_vptr_ChVariableTupleCarrier_1vars[2])(m_tuple_carrier);
  if (CONCAT44(extraout_var,iVar1) != 0) {
    iVar1 = (*m_tuple_carrier->_vptr_ChVariableTupleCarrier_1vars[2])(m_tuple_carrier);
    this->variables = (ChVariables *)CONCAT44(extraout_var_00,iVar1);
    return;
  }
  this_00 = (ChException *)__cxa_allocate_exception(0x28);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"ERROR. SetVariables() getting null pointer. \n","");
  ChException::ChException(this_00,&local_40);
  __cxa_throw(this_00,&ChException::typeinfo,ChException::~ChException);
}

Assistant:

void SetVariables(T& m_tuple_carrier) {
        if (!m_tuple_carrier.GetVariables1()) {
            throw ChException("ERROR. SetVariables() getting null pointer. \n");
        }
        variables = m_tuple_carrier.GetVariables1();
    }